

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-perf-events.h
# Opt level: O0

void __thiscall LinuxEvents<0>::start(LinuxEvents<0> *this)

{
  int iVar1;
  int *in_RDI;
  string *in_stack_00000008;
  LinuxEvents<0> *in_stack_00000010;
  allocator<char> local_61;
  string local_60 [16];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_29;
  string local_28 [40];
  
  iVar1 = ioctl(*in_RDI,0x2403,1);
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    report_error(in_stack_00000010,in_stack_00000008);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator(&local_29);
  }
  iVar1 = ioctl(*in_RDI,0x2400,1);
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    report_error(in_stack_00000010,in_stack_00000008);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return;
}

Assistant:

inline void start() {
    if (ioctl(fd, PERF_EVENT_IOC_RESET, PERF_IOC_FLAG_GROUP) == -1) {
      report_error("ioctl(PERF_EVENT_IOC_RESET)");
    }

    if (ioctl(fd, PERF_EVENT_IOC_ENABLE, PERF_IOC_FLAG_GROUP) == -1) {
      report_error("ioctl(PERF_EVENT_IOC_ENABLE)");
    }
  }